

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_data_source_seek_to_second(ma_data_source *pDataSource,float seekPointInSeconds)

{
  ma_result mVar1;
  ulong uVar2;
  ma_data_source_base *pDataSourceBase;
  ma_uint32 sampleRate;
  ma_uint32 channels;
  ma_format format;
  uint local_14;
  undefined1 local_10 [4];
  undefined1 local_c [4];
  
  if (pDataSource == (ma_data_source *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (*(code **)(*pDataSource + 0x10) != (code *)0x0) {
    mVar1 = (**(code **)(*pDataSource + 0x10))(pDataSource,local_c,local_10,&local_14,0,0);
    if (mVar1 != MA_SUCCESS) {
      return mVar1;
    }
    if (*(code **)(*pDataSource + 8) != (code *)0x0) {
      uVar2 = (ulong)((float)local_14 * seekPointInSeconds);
      uVar2 = (long)((float)local_14 * seekPointInSeconds - 9.223372e+18) & (long)uVar2 >> 0x3f |
              uVar2;
      if (*(ulong *)((long)pDataSource + 0x10) < uVar2) {
        return MA_INVALID_OPERATION;
      }
      mVar1 = (**(code **)(*pDataSource + 8))(pDataSource,uVar2 + *(long *)((long)pDataSource + 8));
      return mVar1;
    }
  }
  return MA_NOT_IMPLEMENTED;
}

Assistant:

MA_API ma_result ma_data_source_seek_to_second(ma_data_source* pDataSource, float seekPointInSeconds)
{
    ma_uint64 frameIndex;
    ma_uint32 sampleRate;
    ma_result result;

    if (pDataSource == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* We need PCM frames instead of seconds */
    frameIndex = (ma_uint64)(seekPointInSeconds * sampleRate);

    return ma_data_source_seek_to_pcm_frame(pDataSource, frameIndex);
}